

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O3

CheckpointDecision * __thiscall
duckdb::DuckTransactionManager::CanCheckpoint
          (CheckpointDecision *__return_storage_ptr__,DuckTransactionManager *this,
          DuckTransaction *transaction,
          unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
          *lock,UndoBufferProperties *undo_properties)

{
  ulong __val;
  undefined8 uVar1;
  char cVar2;
  bool bVar3;
  StorageManager *this_00;
  DBConfig *pDVar4;
  type pDVar5;
  pointer pDVar6;
  long *plVar7;
  __int_type *p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  DuckTransaction *pDVar11;
  __int_type *p_Var12;
  pointer *__ptr;
  CheckpointType type;
  char cVar13;
  _Alloc_hider _Var14;
  DuckTransactionManager *this_01;
  __pthread_internal_list *p_Var15;
  string other_transactions;
  string __str;
  undefined1 local_1b8 [32];
  __atomic_base<unsigned_long> local_198;
  __int_type local_190;
  __int_type local_188;
  __int_type _Stack_180;
  char *local_178;
  uint local_170;
  char local_168 [16];
  DuckTransactionManager *local_158;
  DuckTransaction *local_150;
  BufferManager *local_148;
  undefined1 local_140 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = AttachedDatabase::IsSystem((this->super_TransactionManager).db);
  if (bVar3) {
    p_Var15 = (__pthread_internal_list *)&local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)p_Var15;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"system transaction","");
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_50);
    _Var14._M_p = local_50._M_dataplus._M_p;
LAB_01147bb0:
    if ((__pthread_internal_list *)_Var14._M_p != p_Var15) {
      operator_delete(_Var14._M_p);
    }
    return __return_storage_ptr__;
  }
  this_00 = AttachedDatabase::GetStorageManager((this->super_TransactionManager).db);
  bVar3 = StorageManager::InMemory(this_00);
  if (bVar3) {
    p_Var15 = (__pthread_internal_list *)&local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)p_Var15;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"in memory db","");
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_70);
    _Var14._M_p = local_70._M_dataplus._M_p;
    goto LAB_01147bb0;
  }
  if (this_00->load_complete == false) {
    p_Var15 = (__pthread_internal_list *)&local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)p_Var15;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"cannot checkpoint while loading","");
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_90);
    _Var14._M_p = local_90._M_dataplus._M_p;
    goto LAB_01147bb0;
  }
  bVar3 = DuckTransaction::AutomaticCheckpoint
                    (transaction,(this->super_TransactionManager).db,undo_properties);
  if (!bVar3) {
    p_Var15 = (__pthread_internal_list *)&local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)p_Var15;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"no reason to automatically checkpoint","");
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_b0);
    _Var14._M_p = local_b0._M_dataplus._M_p;
    goto LAB_01147bb0;
  }
  pDVar4 = DBConfig::GetConfig(((this->super_TransactionManager).db)->db);
  if ((pDVar4->options).debug_skip_checkpoint_on_commit == true) {
    p_Var15 = (__pthread_internal_list *)&local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)p_Var15;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"checkpointing on commit disabled through configuration","");
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_d0);
    _Var14._M_p = local_d0._M_dataplus._M_p;
    goto LAB_01147bb0;
  }
  DuckTransaction::TryGetCheckpointLock((DuckTransaction *)local_1b8);
  uVar1 = local_1b8._0_8_;
  local_1b8._0_8_ = (StorageLockKey *)0x0;
  ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
        lock,(pointer)uVar1);
  uVar1 = local_1b8._0_8_;
  if ((StorageLockKey *)local_1b8._0_8_ != (StorageLockKey *)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_1b8._0_8_);
    operator_delete((void *)uVar1);
  }
  if ((lock->super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
      ._M_t.
      super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
      .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl == (StorageLockKey *)0x0)
  {
    p_Var15 = (__pthread_internal_list *)&local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)p_Var15;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,
               "Failed to obtain checkpoint lock - another thread is writing/checkpointing or another read transaction relies on data that is not yet committed"
               ,"");
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_f0);
    _Var14._M_p = local_f0._M_dataplus._M_p;
    goto LAB_01147bb0;
  }
  if (((undo_properties->has_updates == false) && (undo_properties->has_deletes == false)) &&
     (type = FULL_CHECKPOINT, undo_properties->has_dropped_entries != true)) goto LAB_01147f28;
  local_1b8._0_8_ = local_1b8 + 0x10;
  local_1b8._8_8_ = (TransactionManager *)0x0;
  local_1b8[0x10] = '\0';
  this_01 = (DuckTransactionManager *)
            (this->active_transactions).
            super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_158 = (DuckTransactionManager *)
              (this->active_transactions).
              super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  if (this_01 == local_158) {
LAB_01147f0a:
    type = FULL_CHECKPOINT;
  }
  else {
    do {
      pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator*((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                            *)this_01);
      if (pDVar5 != transaction) {
        if ((TransactionManager *)local_1b8._8_8_ != (TransactionManager *)0x0) {
          ::std::__cxx11::string::append(local_1b8);
        }
        pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                 ::operator->((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                               *)this_01);
        __val = pDVar6->transaction_id;
        cVar13 = '\x01';
        if (9 < __val) {
          uVar10 = __val;
          cVar2 = '\x04';
          do {
            cVar13 = cVar2;
            if (uVar10 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_01147cf3;
            }
            if (uVar10 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_01147cf3;
            }
            if (uVar10 < 10000) goto LAB_01147cf3;
            bVar3 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar2 = cVar13 + '\x04';
          } while (bVar3);
          cVar13 = cVar13 + '\x01';
        }
LAB_01147cf3:
        local_178 = local_168;
        ::std::__cxx11::string::_M_construct((ulong)&local_178,cVar13);
        ::std::__detail::__to_chars_10_impl<unsigned_long>(local_178,local_170,__val);
        plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x1db580c);
        pDVar11 = (DuckTransaction *)(plVar7 + 2);
        if ((DuckTransaction *)*plVar7 == pDVar11) {
          local_140._0_8_ = (pDVar11->super_Transaction)._vptr_Transaction;
          local_140._8_8_ = plVar7[3];
          local_150 = (DuckTransaction *)local_140;
        }
        else {
          local_140._0_8_ = (pDVar11->super_Transaction)._vptr_Transaction;
          local_150 = (DuckTransaction *)*plVar7;
        }
        local_148 = (BufferManager *)plVar7[1];
        *plVar7 = (long)pDVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        p_Var8 = (__int_type *)::std::__cxx11::string::append((char *)&local_150);
        local_198._M_i = (__int_type)&local_188;
        p_Var12 = p_Var8 + 2;
        if ((__int_type *)*p_Var8 == p_Var12) {
          local_188 = *p_Var12;
          _Stack_180 = p_Var8[3];
        }
        else {
          local_188 = *p_Var12;
          local_198._M_i = *p_Var8;
        }
        local_190 = p_Var8[1];
        *p_Var8 = (__int_type)p_Var12;
        p_Var8[1] = 0;
        *(undefined1 *)(p_Var8 + 2) = 0;
        ::std::__cxx11::string::_M_append(local_1b8,local_198._M_i);
        if ((__int_type *)local_198._M_i != &local_188) {
          operator_delete((void *)local_198._M_i);
        }
        if (local_150 != (DuckTransaction *)local_140) {
          operator_delete(local_150);
        }
        if (local_178 != local_168) {
          operator_delete(local_178);
        }
      }
      this_01 = (DuckTransactionManager *)&(this_01->super_TransactionManager).db;
    } while (this_01 != local_158);
    if ((TransactionManager *)local_1b8._8_8_ != (TransactionManager *)0x0) {
      bVar3 = true;
      if (undo_properties->has_dropped_entries == true) {
        ::std::operator+(&local_110,
                         "Transaction has dropped catalog entries and there are other transactions active\nActive transactions: "
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b8);
        CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_110);
        paVar9 = &local_110.field_2;
      }
      else {
        type = CONCURRENT_CHECKPOINT;
        if (undo_properties->has_updates != true) goto LAB_01147f0c;
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_140 + 0x10),
                         "Transaction has performed updates and there are other transactions active\nActive transactions: "
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b8);
        CheckpointDecision::CheckpointDecision(__return_storage_ptr__,(string *)(local_140 + 0x10));
        paVar9 = &local_120;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar9->_M_local_buf + -0x10) != paVar9) {
        operator_delete(*(undefined1 **)(paVar9->_M_local_buf + -0x10));
      }
      bVar3 = false;
      goto LAB_01147f0a;
    }
    type = FULL_CHECKPOINT;
    bVar3 = true;
  }
LAB_01147f0c:
  if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if (!bVar3) {
    return __return_storage_ptr__;
  }
LAB_01147f28:
  CheckpointDecision::CheckpointDecision(__return_storage_ptr__,type);
  return __return_storage_ptr__;
}

Assistant:

DuckTransactionManager::CheckpointDecision
DuckTransactionManager::CanCheckpoint(DuckTransaction &transaction, unique_ptr<StorageLockKey> &lock,
                                      const UndoBufferProperties &undo_properties) {
	if (db.IsSystem()) {
		return CheckpointDecision("system transaction");
	}
	auto &storage_manager = db.GetStorageManager();
	if (storage_manager.InMemory()) {
		return CheckpointDecision("in memory db");
	}
	if (!storage_manager.IsLoaded()) {
		return CheckpointDecision("cannot checkpoint while loading");
	}
	if (!transaction.AutomaticCheckpoint(db, undo_properties)) {
		return CheckpointDecision("no reason to automatically checkpoint");
	}
	auto &config = DBConfig::GetConfig(db.GetDatabase());
	if (config.options.debug_skip_checkpoint_on_commit) {
		return CheckpointDecision("checkpointing on commit disabled through configuration");
	}
	// try to lock the checkpoint lock
	lock = transaction.TryGetCheckpointLock();
	if (!lock) {
		return CheckpointDecision("Failed to obtain checkpoint lock - another thread is writing/checkpointing or "
		                          "another read transaction relies on data that is not yet committed");
	}
	auto checkpoint_type = CheckpointType::FULL_CHECKPOINT;
	if (undo_properties.has_updates || undo_properties.has_deletes || undo_properties.has_dropped_entries) {
		// if we have made updates/deletes/catalog changes in this transaction we might need to change our strategy
		// in the presence of other transactions
		string other_transactions;
		for (auto &active_transaction : active_transactions) {
			if (!RefersToSameObject(*active_transaction, transaction)) {
				if (!other_transactions.empty()) {
					other_transactions += ", ";
				}
				other_transactions += "[" + to_string(active_transaction->transaction_id) + "]";
			}
		}
		if (!other_transactions.empty()) {
			// there are other transactions!
			// these active transactions might need data from BEFORE this transaction
			// we might need to change our strategy here based on what changes THIS transaction has made
			if (undo_properties.has_dropped_entries) {
				// this transaction has changed the catalog - we cannot checkpoint
				return CheckpointDecision("Transaction has dropped catalog entries and there are other transactions "
				                          "active\nActive transactions: " +
				                          other_transactions);
			} else if (undo_properties.has_updates) {
				// this transaction has performed updates - we cannot checkpoint
				return CheckpointDecision(
				    "Transaction has performed updates and there are other transactions active\nActive transactions: " +
				    other_transactions);
			} else {
				// this transaction has performed deletes - we cannot vacuum - initiate a concurrent checkpoint instead
				D_ASSERT(undo_properties.has_deletes);
				checkpoint_type = CheckpointType::CONCURRENT_CHECKPOINT;
			}
		}
	}
	return CheckpointDecision(checkpoint_type);
}